

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O0

void WebPCleanupTransparentArea(WebPPicture *pic)

{
  bool bVar1;
  int iVar2;
  int *in_RDI;
  int sub_height;
  int need_reset_1;
  int values [3];
  uint8_t *a_ptr;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr;
  int a_stride;
  int uv_stride;
  int y_stride;
  int height;
  int width;
  int off;
  int need_reset;
  uint32_t argb_value;
  int h;
  int w;
  int y;
  int x;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint32_t local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int *local_8;
  
  if (in_RDI != (int *)0x0) {
    local_14 = in_RDI[2] / 8;
    local_18 = in_RDI[3] / 8;
    if (*in_RDI == 0) {
      local_28 = in_RDI[2];
      local_2c = in_RDI[3];
      local_30 = in_RDI[10];
      local_34 = in_RDI[0xb];
      local_38 = in_RDI[0xe];
      local_40 = *(long *)(in_RDI + 4);
      local_48 = *(long *)(in_RDI + 6);
      local_50 = *(long *)(in_RDI + 8);
      local_58 = *(long *)(in_RDI + 0xc);
      memset(&local_64,0,0xc);
      if ((((local_58 != 0) && (local_40 != 0)) && (local_48 != 0)) && (local_50 != 0)) {
        for (local_10 = 0; local_10 + 8 <= local_2c; local_10 = local_10 + 8) {
          bVar1 = true;
          for (local_c = 0; local_c + 8 <= local_28; local_c = local_c + 8) {
            iVar2 = SmoothenBlock((uint8_t *)(local_58 + local_c),local_38,
                                  (uint8_t *)(local_40 + local_c),local_30,8,8);
            if (iVar2 == 0) {
              bVar1 = true;
            }
            else {
              if (bVar1) {
                local_64 = (uint)*(byte *)(local_40 + local_c);
                local_60 = (uint)*(byte *)(local_48 + (local_c >> 1));
                local_5c = (uint)*(byte *)(local_50 + (local_c >> 1));
                bVar1 = false;
              }
              Flatten((uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
              Flatten((uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
              Flatten((uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
            }
          }
          if (local_c < local_28) {
            SmoothenBlock((uint8_t *)(local_58 + local_c),local_38,(uint8_t *)(local_40 + local_c),
                          local_30,local_28 - local_c,8);
          }
          local_58 = local_58 + (local_38 << 3);
          local_40 = local_40 + (local_30 << 3);
          local_48 = local_48 + (local_34 << 2);
          local_50 = local_50 + (local_34 << 2);
        }
        if (local_10 < local_2c) {
          iVar2 = local_2c - local_10;
          for (local_c = 0; local_c + 8 <= local_28; local_c = local_c + 8) {
            SmoothenBlock((uint8_t *)(local_58 + local_c),local_38,(uint8_t *)(local_40 + local_c),
                          local_30,8,iVar2);
          }
          if (local_c < local_28) {
            SmoothenBlock((uint8_t *)(local_58 + local_c),local_38,(uint8_t *)(local_40 + local_c),
                          local_30,local_28 - local_c,iVar2);
          }
        }
      }
    }
    else {
      local_1c = 0;
      local_8 = in_RDI;
      for (local_10 = 0; local_10 < local_18; local_10 = local_10 + 1) {
        local_20 = 1;
        for (local_c = 0; local_c < local_14; local_c = local_c + 1) {
          local_24 = (local_10 * local_8[0x14] + local_c) * 8;
          iVar2 = IsTransparentARGBArea
                            ((uint32_t *)(*(long *)(local_8 + 0x12) + (long)local_24 * 4),
                             local_8[0x14],8);
          if (iVar2 == 0) {
            local_20 = 1;
          }
          else {
            if (local_20 != 0) {
              local_1c = *(uint32_t *)(*(long *)(local_8 + 0x12) + (long)local_24 * 4);
              local_20 = 0;
            }
            FlattenARGB((uint32_t *)(*(long *)(local_8 + 0x12) + (long)local_24 * 4),local_1c,
                        local_8[0x14],8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void WebPCleanupTransparentArea(WebPPicture* pic) {
  int x, y, w, h;
  if (pic == NULL) return;
  w = pic->width / SIZE;
  h = pic->height / SIZE;

  // note: we ignore the left-overs on right/bottom, except for SmoothenBlock().
  if (pic->use_argb) {
    uint32_t argb_value = 0;
    for (y = 0; y < h; ++y) {
      int need_reset = 1;
      for (x = 0; x < w; ++x) {
        const int off = (y * pic->argb_stride + x) * SIZE;
        if (IsTransparentARGBArea(pic->argb + off, pic->argb_stride, SIZE)) {
          if (need_reset) {
            argb_value = pic->argb[off];
            need_reset = 0;
          }
          FlattenARGB(pic->argb + off, argb_value, pic->argb_stride, SIZE);
        } else {
          need_reset = 1;
        }
      }
    }
  } else {
    const int width = pic->width;
    const int height = pic->height;
    const int y_stride = pic->y_stride;
    const int uv_stride = pic->uv_stride;
    const int a_stride = pic->a_stride;
    uint8_t* y_ptr = pic->y;
    uint8_t* u_ptr = pic->u;
    uint8_t* v_ptr = pic->v;
    const uint8_t* a_ptr = pic->a;
    int values[3] = { 0 };
    if (a_ptr == NULL || y_ptr == NULL || u_ptr == NULL || v_ptr == NULL) {
      return;
    }
    for (y = 0; y + SIZE <= height; y += SIZE) {
      int need_reset = 1;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        if (SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                          SIZE, SIZE)) {
          if (need_reset) {
            values[0] = y_ptr[x];
            values[1] = u_ptr[x >> 1];
            values[2] = v_ptr[x >> 1];
            need_reset = 0;
          }
          Flatten(y_ptr + x,        values[0], y_stride,  SIZE);
          Flatten(u_ptr + (x >> 1), values[1], uv_stride, SIZE2);
          Flatten(v_ptr + (x >> 1), values[2], uv_stride, SIZE2);
        } else {
          need_reset = 1;
        }
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, SIZE);
      }
      a_ptr += SIZE * a_stride;
      y_ptr += SIZE * y_stride;
      u_ptr += SIZE2 * uv_stride;
      v_ptr += SIZE2 * uv_stride;
    }
    if (y < height) {
      const int sub_height = height - y;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      SIZE, sub_height);
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, sub_height);
      }
    }
  }
}